

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O1

void __thiscall CVmUndo::drop_oldest_savept(CVmUndo *this)

{
  uint uVar1;
  CVmUndoMeta *pCVar2;
  CVmUndoMeta *meta;
  CVmUndoMeta *pCVar3;
  
  if (this->savept_cnt_ != 0) {
    this->savept_cnt_ = this->savept_cnt_ - 1;
    if (this->oldest_first_ != (CVmUndoMeta *)0x0) {
      pCVar3 = this->oldest_first_ + 1;
      if (pCVar3 == this->rec_arr_ + this->rec_arr_size_) {
        pCVar3 = this->rec_arr_;
      }
      pCVar2 = (this->oldest_first_->link).next_first;
      if ((pCVar3 != pCVar2) && (pCVar3 != this->next_free_)) {
        do {
          uVar1 = (pCVar3->rec).obj;
          if (uVar1 != 0) {
            (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0xa8))
                      (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),pCVar3);
          }
          pCVar3 = pCVar3 + 1;
          if (pCVar3 == this->rec_arr_ + this->rec_arr_size_) {
            pCVar3 = this->rec_arr_;
          }
          pCVar2 = (this->oldest_first_->link).next_first;
        } while ((pCVar3 != pCVar2) && (pCVar3 != this->next_free_));
      }
      this->oldest_first_ = pCVar2;
      if (pCVar2 != (CVmUndoMeta *)0x0) {
        (pCVar2->link).prev_first = (CVmUndoMeta *)0x0;
      }
    }
    if (this->oldest_first_ == (CVmUndoMeta *)0x0) {
      this->cur_first_ = (CVmUndoMeta *)0x0;
    }
  }
  return;
}

Assistant:

void CVmUndo::drop_oldest_savept(VMG0_)
{
    /* if there are no savepoints, there's nothing to do */
    if (savept_cnt_ == 0)
        return;

    /* decrement the savepoint count, now that this one is gone */
    --savept_cnt_;

    /* forget the oldest lead pointer */
    if (oldest_first_ != 0)
    {
        /* 
         *   discard records from the oldest lead pointer to the next
         *   oldest lead pointer 
         */
        CVmUndoMeta *meta;
        for (meta = oldest_first_, inc_rec_ptr(&meta) ;
             meta != oldest_first_->link.next_first && meta != next_free_ ; )
        {
            /* discard this entry, if it still exists */
            if (meta->rec.obj != VM_INVALID_OBJ)
                vm_objp(vmg_ meta->rec.obj)->discard_undo(vmg_ &meta->rec);
            
            /* advance to the next record */
            inc_rec_ptr(&meta);
        }
        
        /* advance the oldest pointer to the next savepoint's first record */
        oldest_first_ = oldest_first_->link.next_first;

        /* there's now nothing before this one */
        if (oldest_first_ != 0)
            oldest_first_->link.prev_first = 0;
    }

    /* if we don't have an oldest, we also don't have a current */
    if (oldest_first_ == 0)
        cur_first_ = 0;
}